

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugFrame::dump
          (DWARFDebugFrame *this,raw_ostream *OS,MCRegisterInfo *MRI,Optional<unsigned_long> Offset)

{
  bool bVar1;
  unsigned_long *puVar2;
  FrameEntry *pFVar3;
  reference this_00;
  pointer pFVar4;
  unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *Entry_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
  *__range1;
  FrameEntry *Entry;
  MCRegisterInfo *MRI_local;
  raw_ostream *OS_local;
  DWARFDebugFrame *this_local;
  Optional<unsigned_long> Offset_local;
  
  this_local = (DWARFDebugFrame *)Offset.Storage.field_0;
  Offset_local.Storage.field_0.empty = Offset.Storage.hasVal;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this_local);
  if (bVar1) {
    puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&this_local);
    pFVar3 = getEntryAtOffset(this,*puVar2);
    if (pFVar3 != (FrameEntry *)0x0) {
      (*pFVar3->_vptr_FrameEntry[2])(pFVar3,OS,MRI,(ulong)(this->IsEH & 1));
    }
  }
  else {
    raw_ostream::operator<<(OS,"\n");
    __end1 = std::
             vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
             ::begin(&this->Entries);
    Entry_1 = (unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *)
              std::
              vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
              ::end(&this->Entries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
                                       *)&Entry_1), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
                ::operator*(&__end1);
      pFVar4 = std::
               unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>::
               operator->(this_00);
      (*pFVar4->_vptr_FrameEntry[2])(pFVar4,OS,MRI,(ulong)(this->IsEH & 1));
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void DWARFDebugFrame::dump(raw_ostream &OS, const MCRegisterInfo *MRI,
                           Optional<uint64_t> Offset) const {
  if (Offset) {
    if (auto *Entry = getEntryAtOffset(*Offset))
      Entry->dump(OS, MRI, IsEH);
    return;
  }

  OS << "\n";
  for (const auto &Entry : Entries)
    Entry->dump(OS, MRI, IsEH);
}